

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.cc
# Opt level: O2

void __thiscall re2::ExhaustiveTester::HandleRegexp(ExhaustiveTester *this,string *const_regexp)

{
  StringGenerator *this_00;
  bool bVar1;
  StringPiece *text;
  int iVar2;
  string regexp;
  Tester tester;
  char *local_70;
  int local_68;
  string local_50;
  StringPiece local_30;
  
  this->regexps_ = this->regexps_ + 1;
  std::__cxx11::string::string((string *)&local_70,(string *)const_regexp);
  if ((this->topwrapper_)._M_string_length != 0) {
    StringPrintf_abi_cxx11_(&local_50,(this->topwrapper_)._M_dataplus._M_p,local_70);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (FLAGS_show_regexps == '\x01') {
    printf("\r%s",local_70);
    fflush(_stdout);
  }
  local_30.ptr_ = local_70;
  local_30.length_ = local_68;
  Tester::Tester((Tester *)&local_50,&local_30);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    this_00 = &this->strgen_;
    StringGenerator::Reset(this_00);
    StringGenerator::GenerateNULL(this_00);
    if (this->randomstrings_ == true) {
      StringGenerator::Random(this_00,this->stringseed_,this->stringcount_);
    }
    iVar2 = 0;
    do {
      do {
        if ((this->strgen_).hasnext_ != true) goto LAB_001214cd;
        this->tests_ = this->tests_ + 1;
        text = StringGenerator::Next(this_00);
        bVar1 = Tester::TestInput((Tester *)&local_50,text);
      } while (bVar1);
      this->failures_ = this->failures_ + 1;
      iVar2 = iVar2 + 1;
    } while (iVar2 < FLAGS_max_bad_regexp_inputs);
  }
LAB_001214cd:
  Tester::~Tester((Tester *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void ExhaustiveTester::HandleRegexp(const string& const_regexp) {
  regexps_++;
  string regexp = const_regexp;
  if (!topwrapper_.empty())
    regexp = StringPrintf(topwrapper_.c_str(), regexp.c_str());

  if (FLAGS_show_regexps) {
    printf("\r%s", regexp.c_str());
    fflush(stdout);
  }

  if (LOGGING) {
    // Write out test cases and answers for use in testing
    // other implementations, such as Go's regexp package.
    if (randomstrings_)
      LOG(ERROR) << "Cannot log with random strings.";
    if (regexps_ == 1) {  // first
      printf("strings\n");
      strgen_.Reset();
      while (strgen_.HasNext())
        printf("%s\n", escape(strgen_.Next()));
      printf("regexps\n");
    }
    printf("%s\n", escape(regexp));

    RE2 re(regexp);
    RE2::Options longest;
    longest.set_longest_match(true);
    RE2 relongest(regexp, longest);
    int ngroup = re.NumberOfCapturingGroups()+1;
    StringPiece* group = new StringPiece[ngroup];

    strgen_.Reset();
    while (strgen_.HasNext()) {
      StringPiece input = strgen_.Next();
      PrintResult(re, input, RE2::ANCHOR_BOTH, group, ngroup);
      printf(";");
      PrintResult(re, input, RE2::UNANCHORED, group, ngroup);
      printf(";");
      PrintResult(relongest, input, RE2::ANCHOR_BOTH, group, ngroup);
      printf(";");
      PrintResult(relongest, input, RE2::UNANCHORED, group, ngroup);
      printf("\n");
    }
    delete[] group;
    return;
  }

  Tester tester(regexp);
  if (tester.error())
    return;

  strgen_.Reset();
  strgen_.GenerateNULL();
  if (randomstrings_)
    strgen_.Random(stringseed_, stringcount_);
  int bad_inputs = 0;
  while (strgen_.HasNext()) {
    tests_++;
    if (!tester.TestInput(strgen_.Next())) {
      failures_++;
      if (++bad_inputs >= FLAGS_max_bad_regexp_inputs)
        break;
    }
  }
}